

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irExprList * build_ir_exprlist(Context_conflict *ctx,MOJOSHADER_astArguments *args)

{
  MOJOSHADER_irExprList *pMVar1;
  MOJOSHADER_irExpression *expr;
  MOJOSHADER_irExprList *pMVar2;
  MOJOSHADER_irExprList *item;
  MOJOSHADER_irExprList *prev;
  MOJOSHADER_irExprList *retval;
  MOJOSHADER_astArguments *args_local;
  Context_conflict *ctx_local;
  
  prev = (MOJOSHADER_irExprList *)0x0;
  item = (MOJOSHADER_irExprList *)0x0;
  retval = (MOJOSHADER_irExprList *)args;
  while( true ) {
    if (retval == (MOJOSHADER_irExprList *)0x0) {
      return prev;
    }
    if (((prev == (MOJOSHADER_irExprList *)0x0) || (item == (MOJOSHADER_irExprList *)0x0)) &&
       ((prev != (MOJOSHADER_irExprList *)0x0 || (item != (MOJOSHADER_irExprList *)0x0)))) break;
    expr = build_ir_expr(ctx,retval->expr);
    pMVar2 = new_ir_exprlist(ctx,expr);
    pMVar1 = pMVar2;
    if (item != (MOJOSHADER_irExprList *)0x0) {
      item->next = pMVar2;
      pMVar2 = item;
      pMVar1 = prev;
    }
    prev = pMVar1;
    item = pMVar2;
    retval = retval->next;
  }
  __assert_fail("(retval && prev) || ((!retval) && (!prev))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x1485,
                "MOJOSHADER_irExprList *build_ir_exprlist(Context *, MOJOSHADER_astArguments *)");
}

Assistant:

static MOJOSHADER_irExprList *build_ir_exprlist(Context *ctx, MOJOSHADER_astArguments *args)
{
    MOJOSHADER_irExprList *retval = NULL;
    MOJOSHADER_irExprList *prev = NULL;

    while (args != NULL)
    {
        assert((retval && prev) || ((!retval) && (!prev)));

        MOJOSHADER_irExprList *item = new_ir_exprlist(ctx, build_ir_expr(ctx, args->argument));
        if (prev == NULL)
            prev = retval = item;
        else
            prev->next = item;

        args = args->next;
    } // while

    return retval;
}